

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O1

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_miter
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double dx1,double dy1,double dx2,double dy2,line_join_e lj,double mlimit,
          double dbevel)

{
  double dVar1;
  point_base<double> *ppVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double x2;
  double y2;
  
  dVar15 = v1->x;
  dVar1 = v1->y;
  dVar12 = v0->x + dx1;
  dVar10 = v0->y - dy1;
  dVar13 = dVar15 + dx1;
  dVar18 = dVar1 - dy1;
  dVar8 = v2->x;
  dVar9 = v2->y;
  dVar16 = (dVar8 + dx2) - (dVar15 + dx2);
  dVar17 = (dVar9 - dy2) - (dVar1 - dy2);
  dVar19 = (dVar13 - dVar12) * dVar17 - dVar16 * (dVar18 - dVar10);
  dVar11 = ABS(dVar19);
  dVar14 = dVar15;
  dVar20 = dVar1;
  if (1e-30 <= dVar11) {
    dVar19 = ((dVar10 - (dVar1 - dy2)) * dVar16 - dVar17 * (dVar12 - (dVar15 + dx2))) / dVar19;
    dVar14 = (dVar13 - dVar12) * dVar19 + dVar12;
    dVar20 = dVar19 * (dVar18 - dVar10) + dVar10;
  }
  dVar10 = this->m_width_abs * mlimit;
  if (dVar11 < 1e-30) {
    bVar3 = (dVar1 - v0->y) * (dVar13 - dVar15) - (dVar15 - v0->x) * (dVar18 - dVar1) < 0.0;
    bVar4 = 0.0 <= (dVar9 - dVar1) * (dVar13 - dVar8) - (dVar8 - dVar15) * (dVar18 - dVar9);
    bVar7 = bVar3 == bVar4;
    if (bVar3 != bVar4) {
      uVar6 = vc->m_size >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = dVar13;
      *(double *)((long)&ppVar2->y + uVar5) = dVar18;
      vc->m_size = uVar6 + 1;
    }
    dVar15 = 1.0;
  }
  else {
    dVar15 = (dVar14 - dVar15) * (dVar14 - dVar15) + (dVar20 - dVar1) * (dVar20 - dVar1);
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    bVar7 = dVar10 < dVar15;
    if (!bVar7) {
      uVar6 = vc->m_size >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = dVar14;
      *(double *)((long)&ppVar2->y + uVar5) = dVar20;
      vc->m_size = uVar6 + 1;
      bVar7 = false;
    }
  }
  if (bVar7) {
    if (lj == miter_join_round) {
      calc_arc(this,vc,v1->x,v1->y,dx1,-dy1,dx2,-dy2);
      return;
    }
    if (lj == miter_join_revert) {
      dVar15 = v1->x;
      dVar1 = v1->y;
      uVar6 = vc->m_size >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = dx1 + dVar15;
      *(double *)((long)&ppVar2->y + uVar5) = dVar1 - dy1;
      uVar6 = uVar6 + 1;
      vc->m_size = uVar6;
      dVar15 = v1->x;
      dVar1 = v1->y;
      uVar6 = uVar6 >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = dx2 + dVar15;
      *(double *)((long)&ppVar2->y + uVar5) = dVar1 - dy2;
    }
    else if (dVar11 < 1e-30) {
      dVar8 = (double)this->m_width_sign * mlimit;
      dVar15 = v1->x;
      dVar1 = v1->y;
      uVar6 = vc->m_size >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = dy1 * dVar8 + dVar15 + dx1;
      *(double *)((long)&ppVar2->y + uVar5) = dx1 * dVar8 + (dVar1 - dy1);
      uVar6 = uVar6 + 1;
      vc->m_size = uVar6;
      dVar15 = v1->x;
      dVar1 = v1->y;
      uVar6 = uVar6 >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = (dVar15 + dx2) - dy2 * dVar8;
      *(double *)((long)&ppVar2->y + uVar5) = (dVar1 - dy2) - dx2 * dVar8;
    }
    else {
      dVar1 = dx1 + v1->x;
      dVar8 = v1->y - dy1;
      dVar9 = dx2 + v1->x;
      dVar11 = v1->y - dy2;
      dVar15 = (dVar10 - dbevel) / (dVar15 - dbevel);
      uVar6 = vc->m_size >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = (dVar14 - dVar1) * dVar15 + dVar1;
      *(double *)((long)&ppVar2->y + uVar5) = (dVar20 - dVar8) * dVar15 + dVar8;
      uVar6 = uVar6 + 1;
      vc->m_size = uVar6;
      uVar6 = uVar6 >> 6;
      if (vc->m_num_blocks <= uVar6) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
      }
      ppVar2 = vc->m_blocks[uVar6];
      uVar6 = vc->m_size;
      uVar5 = (ulong)((uVar6 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar5) = (dVar14 - dVar9) * dVar15 + dVar9;
      *(double *)((long)&ppVar2->y + uVar5) = (dVar20 - dVar11) * dVar15 + dVar11;
    }
    vc->m_size = uVar6 + 1;
  }
  return;
}

Assistant:

void math_stroke<VC>::calc_miter(VC& vc,
                                     const vertex_dist& v0, 
                                     const vertex_dist& v1, 
                                     const vertex_dist& v2,
                                     double dx1, double dy1, 
                                     double dx2, double dy2,
                                     line_join_e lj,
                                     double mlimit,
                                     double dbevel)
    {
        double xi  = v1.x;
        double yi  = v1.y;
        double di  = 1;
        double lim = m_width_abs * mlimit;
        bool miter_limit_exceeded = true; // Assume the worst
        bool intersection_failed  = true; // Assume the worst

        if(calc_intersection(v0.x + dx1, v0.y - dy1,
                             v1.x + dx1, v1.y - dy1,
                             v1.x + dx2, v1.y - dy2,
                             v2.x + dx2, v2.y - dy2,
                             &xi, &yi))
        {
            // Calculation of the intersection succeeded
            //---------------------
            di = calc_distance(v1.x, v1.y, xi, yi);
            if(di <= lim)
            {
                // Inside the miter limit
                //---------------------
                add_vertex(vc, xi, yi);
                miter_limit_exceeded = false;
            }
            intersection_failed = false;
        }
        else
        {
            // Calculation of the intersection failed, most probably
            // the three points lie one straight line. 
            // First check if v0 and v2 lie on the opposite sides of vector: 
            // (v1.x, v1.y) -> (v1.x+dx1, v1.y-dy1), that is, the perpendicular
            // to the line determined by vertices v0 and v1.
            // This condition determines whether the next line segments continues
            // the previous one or goes back.
            //----------------
            double x2 = v1.x + dx1;
            double y2 = v1.y - dy1;
            if((cross_product(v0.x, v0.y, v1.x, v1.y, x2, y2) < 0.0) == 
               (cross_product(v1.x, v1.y, v2.x, v2.y, x2, y2) < 0.0))
            {
                // This case means that the next segment continues 
                // the previous one (straight line)
                //-----------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                miter_limit_exceeded = false;
            }
        }

        if(miter_limit_exceeded)
        {
            // Miter limit exceeded
            //------------------------
            switch(lj)
            {
            case miter_join_revert:
                // For the compatibility with SVG, PDF, etc, 
                // we use a simple bevel join instead of
                // "smart" bevel
                //-------------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case miter_join_round:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default:
                // If no miter-revert, calculate new dx1, dy1, dx2, dy2
                //----------------
                if(intersection_failed)
                {
                    mlimit *= m_width_sign;
                    add_vertex(vc, v1.x + dx1 + dy1 * mlimit, 
                                   v1.y - dy1 + dx1 * mlimit);
                    add_vertex(vc, v1.x + dx2 - dy2 * mlimit, 
                                   v1.y - dy2 - dx2 * mlimit);
                }
                else
                {
                    double x1 = v1.x + dx1;
                    double y1 = v1.y - dy1;
                    double x2 = v1.x + dx2;
                    double y2 = v1.y - dy2;
                    di = (lim - dbevel) / (di - dbevel);
                    add_vertex(vc, x1 + (xi - x1) * di, 
                                   y1 + (yi - y1) * di);
                    add_vertex(vc, x2 + (xi - x2) * di, 
                                   y2 + (yi - y2) * di);
                }
                break;
            }
        }
    }